

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::Parser(Parser *this)

{
  value_type local_12;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::vector(&this->entries);
  std::
  map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
  ::map(&this->macros);
  std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::set(&this->macroLabels);
  std::vector<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>::vector
            (&this->conditionStack);
  this->initializingMacro = false;
  this->overrideFileInfo = false;
  local_12.inTrueBlock = true;
  local_12.inUnknownBlock = false;
  std::vector<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>::push_back
            (&this->conditionStack,&local_12);
  clearError(this);
  return;
}

Assistant:

Parser::Parser()
{
	initializingMacro = false;
	overrideFileInfo = false;
	conditionStack.push_back({true,false});
	clearError();
}